

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Stretch ON_Font::FontStretchFromUnsigned(uint unsigned_font_stretch)

{
  Stretch local_9;
  uint unsigned_font_stretch_local;
  
  switch(unsigned_font_stretch) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = Ultracondensed;
    break;
  case 2:
    local_9 = Extracondensed;
    break;
  case 3:
    local_9 = Condensed;
    break;
  case 4:
    local_9 = Semicondensed;
    break;
  case 5:
    local_9 = Medium;
    break;
  case 6:
    local_9 = Semiexpanded;
    break;
  case 7:
    local_9 = Expanded;
    break;
  case 8:
    local_9 = Extraexpanded;
    break;
  case 9:
    local_9 = Ultraexpanded;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1af0,"","unsigned_font_stretch is not valid");
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_Font::Stretch ON_Font::FontStretchFromUnsigned(
  unsigned int unsigned_font_stretch
  )
{
  switch (unsigned_font_stretch)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Ultracondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Extracondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Condensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Semicondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Medium);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Semiexpanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Expanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Extraexpanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Ultraexpanded);
  default:
    break;
  }
  ON_ERROR("unsigned_font_stretch is not valid");
  return ON_Font::Stretch::Unset;
}